

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_mf_cc.hpp
# Opt level: O2

bind_t<void,_boost::_mfi::mf0<void,_boost::unit_test::test_unit_fixture>,_boost::_bi::list1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>_>_>
* __thiscall
boost::
bind<void,boost::unit_test::test_unit_fixture,boost::shared_ptr<boost::unit_test::test_unit_fixture>>
          (bind_t<void,_boost::_mfi::mf0<void,_boost::unit_test::test_unit_fixture>,_boost::_bi::list1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>_>_>
           *__return_storage_ptr__,boost *this,F f,
          shared_ptr<boost::unit_test::test_unit_fixture> *a1)

{
  value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_> local_40;
  list1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>_> local_30;
  
  local_40.t_.px = a1->px;
  local_40.t_.pn.pi_ = (a1->pn).pi_;
  if (local_40.t_.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_40.t_.pn.pi_)->use_count_ = (local_40.t_.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  _bi::list1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>_>::list1
            (&local_30,&local_40);
  (__return_storage_ptr__->f_).f_ = (F)this;
  *(F *)&(__return_storage_ptr__->f_).field_0x8 = f;
  (__return_storage_ptr__->l_).
  super_storage1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>_>.a1_.t_
  .px = local_30.
        super_storage1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>_>.
        a1_.t_.px;
  (__return_storage_ptr__->l_).
  super_storage1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>_>.a1_.t_
  .pn.pi_ = local_30.
            super_storage1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>_>
            .a1_.t_.pn.pi_;
  if (local_30.
      super_storage1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>_>.
      a1_.t_.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_30.
     super_storage1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>_>.a1_
     .t_.pn.pi_)->use_count_ =
         (local_30.
          super_storage1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>_>
          .a1_.t_.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  detail::shared_count::~shared_count
            (&local_30.
              super_storage1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>_>
              .a1_.t_.pn);
  detail::shared_count::~shared_count(&local_40.t_.pn);
  return __return_storage_ptr__;
}

Assistant:

_bi::bind_t<R, _mfi::BOOST_BIND_MF_NAME(mf0)<R, T>, typename _bi::list_av_1<A1>::type>
    BOOST_BIND(R (BOOST_BIND_MF_CC T::*f) () BOOST_BIND_MF_NOEXCEPT, A1 a1)
{
    typedef _mfi::BOOST_BIND_MF_NAME(mf0)<R, T> F;
    typedef typename _bi::list_av_1<A1>::type list_type;
    return _bi::bind_t<R, F, list_type>(F(f), list_type(a1));
}